

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_value_numeric_type(sqlite3_value *pVal)

{
  ulong uVar1;
  Mem *pMem;
  
  uVar1 = (ulong)(pVal->flags & 0x3f);
  if ((0x4000000040004U >> uVar1 & 1) != 0) {
    applyNumericAffinity(pVal,0);
    uVar1 = (ulong)(pVal->flags & 0x3f);
  }
  return (int)"\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
              [uVar1];
}

Assistant:

SQLITE_API int sqlite3_value_numeric_type(sqlite3_value *pVal){
  int eType = sqlite3_value_type(pVal);
  if( eType==SQLITE_TEXT ){
    Mem *pMem = (Mem*)pVal;
    applyNumericAffinity(pMem, 0);
    eType = sqlite3_value_type(pVal);
  }
  return eType;
}